

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

void __thiscall helics::apps::Clone::addSubscription(Clone *this,string_view key)

{
  _Map_pointer ppIVar1;
  Input *pIVar2;
  string_view target;
  iterator iVar3;
  Input *pIVar4;
  mapped_type *pmVar5;
  _Elt_pointer pIVar6;
  string *psVar7;
  int iVar8;
  InterfaceHandle subid;
  key_type local_44;
  key_type local_40;
  key_type local_30;
  
  local_40._M_str = key._M_str;
  local_40._M_len = key._M_len;
  iVar3 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->subkeys)._M_t,&local_40);
  if (((_Rb_tree_header *)iVar3._M_node == &(this->subkeys)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar3._M_node[1]._M_left == -1)) {
    target._M_str = local_40._M_str;
    target._M_len = local_40._M_len;
    pIVar4 = helics::ValueFederate::registerSubscription
                       (&((this->super_App).fed.
                          super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ValueFederate,target,(string_view)ZEXT816(0));
    std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
              ((deque<helics::Input,std::allocator<helics::Input>> *)&this->subscriptions,pIVar4);
    ppIVar1 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pIVar4 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pIVar2 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first;
    iVar8 = (int)((ulong)((long)(this->subscriptions).
                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * 0x286bca1b +
            (int)((ulong)((long)pIVar4 - (long)pIVar2) >> 4) * 0x286bca1b +
            (int)((ulong)((long)ppIVar1 -
                         (long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) +
            (uint)(ppIVar1 == (_Map_pointer)0x0) + -2;
    if (pIVar4 == pIVar2) {
      pIVar4 = ppIVar1[-1] + 1;
    }
    local_44.hid = pIVar4[-1].super_Interface.handle.hid;
    pmVar5 = CLI::std::
             map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
             ::operator[](&this->subids,&local_44);
    *pmVar5 = iVar8;
    pIVar6 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pIVar6 == (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pIVar6 = (this->subscriptions).
               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    if (pIVar6[-1].givenTarget._M_string_length == 0) {
      psVar7 = Interface::getSourceTargets_abi_cxx11_(&pIVar6[-1].super_Interface);
    }
    else {
      psVar7 = &pIVar6[-1].givenTarget;
    }
    local_30._M_str = (psVar7->_M_dataplus)._M_p;
    local_30._M_len = psVar7->_M_string_length;
    pmVar5 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->subkeys,&local_30);
    *pmVar5 = iVar8;
  }
  return;
}

Assistant:

void Clone::addSubscription(std::string_view key)
{
    auto res = subkeys.find(key);
    if ((res == subkeys.end()) || (res->second == -1)) {
        subscriptions.emplace_back(fed->registerSubscription(key));
        auto index = static_cast<int>(subscriptions.size()) - 1;
        auto subid = subscriptions.back().getHandle();
        subids[subid] = index;  // this is a new element
        subkeys[subscriptions.back().getTarget()] = index;  // this is a potential replacement
    }
}